

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O3

int __thiscall Cipher::Processor::init(Processor *this,EVP_PKEY_CTX *ctx)

{
  TClusters *clusters;
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  pointer piVar3;
  pointer piVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 extraout_RAX;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RCX;
  TFreqMap *in_RDX;
  TSimilarityMap *this_00;
  Processor *pPVar8;
  TClusterToLetterMap *in_R9;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_70;
  pointer piStack_40;
  pointer local_38;
  pointer piStack_30;
  
  uVar2 = *(undefined8 *)(ctx + 0x20);
  (this->m_params).wEnglishFreq = (float)(int)uVar2;
  (this->m_params).nHypothesesToKeep = (int)((ulong)uVar2 >> 0x20);
  uVar2 = *(undefined8 *)ctx;
  uVar6 = *(undefined8 *)(ctx + 8);
  uVar7 = *(undefined8 *)(ctx + 0x18);
  (this->m_params).fSpread = *(double *)(ctx + 0x10);
  (this->m_params).temp0 = (float)(int)uVar7;
  (this->m_params).coolingRate = (float)(int)((ulong)uVar7 >> 0x20);
  (this->m_params).minClusters = (int)uVar2;
  (this->m_params).maxClusters = (int)((ulong)uVar2 >> 0x20);
  (this->m_params).nInitialIters = (int)uVar6;
  (this->m_params).nIters = (int)((ulong)uVar6 >> 0x20);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->m_params).hint,(vector<int,_std::allocator<int>_> *)(ctx + 0x28));
  this->m_freqMap = in_RDX;
  this_00 = &this->m_similarityMap;
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(this_00,in_RCX);
  p_Var1 = &local_70._M_impl.super__Rb_tree_header;
  local_70._M_impl._0_8_ = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  piStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  piStack_30 = (pointer)0x0;
  (this->m_curResult).id = 0;
  (this->m_curResult).p = -999.0;
  (this->m_curResult).pClusters = -999.0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear(&(this->m_curResult).clMap._M_t);
  if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_70._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_70._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_70._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_70._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_70._M_impl.super__Rb_tree_header._M_node_count;
    local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  clusters = &(this->m_curResult).clusters;
  piVar3 = (this->m_curResult).clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->m_curResult).clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_curResult).clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = piStack_40;
  (this->m_curResult).clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38;
  (this->m_curResult).clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = piStack_30;
  piStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  piStack_30 = (pointer)0x0;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3,(long)piVar4 - (long)piVar3);
    if (piStack_40 != (pointer)0x0) {
      operator_delete(piStack_40,(long)piStack_30 - (long)piStack_40);
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_70);
  normalizeSimilarityMap(&this->m_params,this_00,&this->m_logMap,&this->m_logMapInv);
  pPVar8 = this;
  generateClustersInitialGuess(&this->m_params,this_00,clusters);
  this->m_nInitialIters = 0;
  dVar5 = calcPClusters(&pPVar8->m_params,this_00,&this->m_logMap,&this->m_logMapInv,clusters,in_R9)
  ;
  this->m_pCur = dVar5;
  (this->m_curResult).pClusters = dVar5;
  this->m_pZero = dVar5;
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool Processor::init(
            const TParameters & params,
            const TFreqMap & freqMap,
            const TSimilarityMap & similarityMap) {
        m_params = params;
        m_freqMap = &freqMap;
        m_similarityMap = similarityMap;
        m_curResult = {};

        normalizeSimilarityMap(m_params, m_similarityMap, m_logMap, m_logMapInv);
        generateClustersInitialGuess(m_params, m_similarityMap, m_curResult.clusters);

        //Cipher::beamSearch(m_params, *m_freqMap, m_curResult);
        m_nInitialIters = 0;
        m_pCur = calcPClusters(m_params, m_similarityMap, m_logMap, m_logMapInv, m_curResult.clusters, m_curResult.clMap);
        m_curResult.pClusters = m_pCur;
        m_pZero = m_pCur;

        return true;
    }